

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

void nn_bipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  int iVar1;
  ulong extraout_RAX;
  nn_list_item *it;
  nn_list_item *pnVar2;
  nn_aipc *self_01;
  
  if (type == -3 && src == -2) goto LAB_0012c026;
  while( true ) {
    if ((*(int *)&self[1].fn == 3) && (nn_bipc_shutdown_cold_2(), (extraout_RAX & 1) != 0)) {
      return;
    }
    iVar1 = *(int *)&self[1].fn;
    if (iVar1 == 4) break;
    if (iVar1 == 5) {
      if ((src != 2) || (type != 0x85b9)) {
        nn_bipc_shutdown_cold_3();
      }
      nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x720));
      nn_aipc_term((nn_aipc *)srcptr);
      nn_free(srcptr);
LAB_0012c0cf:
      iVar1 = nn_list_empty((nn_list *)&self[8].state);
      if (iVar1 == 0) {
        return;
      }
      *(undefined4 *)&self[1].fn = 1;
      nn_fsm_stopped_noevent(self);
      nn_ep_stopped((nn_ep *)self[1].shutdown_fn);
      return;
    }
    nn_bipc_shutdown_cold_4();
LAB_0012c026:
    nn_bipc_shutdown_cold_1();
  }
  iVar1 = nn_usock_isidle((nn_usock *)&self[1].state);
  if (iVar1 == 0) {
    return;
  }
  self_00 = &self[8].state;
  for (it = nn_list_begin((nn_list *)self_00); pnVar2 = nn_list_end((nn_list *)self_00),
      it != pnVar2; it = nn_list_next((nn_list *)self_00,it)) {
    self_01 = (nn_aipc *)(it + -0x72);
    if (it == (nn_list_item *)0x0) {
      self_01 = (nn_aipc *)0x0;
    }
    nn_aipc_stop(self_01);
  }
  *(undefined4 *)&self[1].fn = 5;
  goto LAB_0012c0cf;
}

Assistant:

static void nn_bipc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
#if defined NN_HAVE_UNIX_SOCKETS
    const char *addr;
    int rc;
#endif

    struct nn_bipc *bipc;
    struct nn_list_item *it;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (bipc->aipc) {
            nn_aipc_stop (bipc->aipc);
            bipc->state = NN_BIPC_STATE_STOPPING_AIPC;
        }
        else {
            bipc->state = NN_BIPC_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_AIPC)) {
        if (!nn_aipc_isidle (bipc->aipc))
            return;
        nn_aipc_term (bipc->aipc);
        nn_free (bipc->aipc);
        bipc->aipc = NULL;

        /* On *nixes, unlink the domain socket file */
#if defined NN_HAVE_UNIX_SOCKETS
        addr = nn_ep_getaddr (bipc->ep);
        rc = unlink(addr);
        errno_assert (rc == 0 || errno == ENOENT);
#endif

        nn_usock_stop (&bipc->usock);
        bipc->state = NN_BIPC_STATE_STOPPING_USOCK;
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&bipc->usock))
            return;
        for (it = nn_list_begin (&bipc->aipcs);
              it != nn_list_end (&bipc->aipcs);
              it = nn_list_next (&bipc->aipcs, it)) {
            aipc = nn_cont (it, struct nn_aipc, item);
            nn_aipc_stop (aipc);
        }
        bipc->state = NN_BIPC_STATE_STOPPING_AIPCS;
        goto aipcs_stopping;
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_AIPCS)) {
        nn_assert (src == NN_BIPC_SRC_AIPC && type == NN_AIPC_STOPPED);
        aipc = (struct nn_aipc *) srcptr;
        nn_list_erase (&bipc->aipcs, &aipc->item);
        nn_aipc_term (aipc);
        nn_free (aipc);

        /*  If there are no more aipc state machines, we can stop the whole
            bipc object. */
aipcs_stopping:
        if (nn_list_empty (&bipc->aipcs)) {
            bipc->state = NN_BIPC_STATE_IDLE;
            nn_fsm_stopped_noevent (&bipc->fsm);
            nn_ep_stopped (bipc->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_state(bipc->state, src, type);
}